

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> * __thiscall
MPLSParser::getPgStreams
          (vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *__return_storage_ptr__,
          MPLSParser *this)

{
  pointer pMVar1;
  MPLSStreamInfo *i;
  pointer __x;
  
  (__return_storage_ptr__->super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar1 = (this->m_streamInfo).super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->m_streamInfo).
             super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
             super__Vector_impl_data._M_start; __x != pMVar1; __x = __x + 1) {
    if ((__x->super_M2TSStreamInfo).stream_coding_type == SUB_PGS) {
      std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::push_back
                (__return_storage_ptr__,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<MPLSStreamInfo> MPLSParser::getPgStreams() const
{
    std::vector<MPLSStreamInfo> pgStreams;
    for (auto& i : m_streamInfo)
    {
        const StreamType coding_type = i.stream_coding_type;
        if (coding_type == StreamType::SUB_PGS)
            pgStreams.push_back(i);
    }
    return pgStreams;
}